

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void convolve_add_src_horiz_hip
               (uint8_t *src,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,
               InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h,int round0_bits)

{
  byte bVar1;
  int iVar2;
  uint8_t *a;
  byte bVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int sum;
  int rounding;
  int16_t *x_filter;
  uint8_t *src_x;
  int in_stack_00000018;
  int x;
  int x_q4;
  int y;
  int bd;
  int local_3c;
  uint local_38;
  int local_34;
  long local_18;
  long local_8;
  
  local_8 = in_RDI + -3;
  local_18 = in_RDX;
  for (local_34 = 0; local_34 < in_stack_00000018; local_34 = local_34 + 1) {
    local_38 = in_R9D;
    for (local_3c = 0; local_3c < (int)src_x; local_3c = local_3c + 1) {
      a = (uint8_t *)(local_8 + ((int)local_38 >> 4));
      bVar1 = a[3];
      iVar2 = horz_scalar_product(a,(int16_t *)(in_R8 + (long)(int)(local_38 & 0xf) * 0x10));
      bVar3 = (byte)x_q4;
      iVar2 = clamp((int)(iVar2 + (uint)bVar1 * 0x80 + 0x4000 + ((1 << (bVar3 & 0x1f)) >> 1)) >>
                    (bVar3 & 0x1f),0,(1 << (0x10 - bVar3 & 0x1f)) + -1);
      *(short *)(local_18 + (long)local_3c * 2) = (short)iVar2;
      local_38 = (int)x_filter + local_38;
    }
    local_8 = in_RSI + local_8;
    local_18 = in_RCX * 2 + local_18;
  }
  return;
}

Assistant:

static void convolve_add_src_horiz_hip(const uint8_t *src, ptrdiff_t src_stride,
                                       uint16_t *dst, ptrdiff_t dst_stride,
                                       const InterpKernel *x_filters, int x0_q4,
                                       int x_step_q4, int w, int h,
                                       int round0_bits) {
  const int bd = 8;
  src -= SUBPEL_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_q4 = x0_q4;
    for (int x = 0; x < w; ++x) {
      const uint8_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
      const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
      const int rounding = ((int)src_x[SUBPEL_TAPS / 2 - 1] << FILTER_BITS) +
                           (1 << (bd + FILTER_BITS - 1));
      const int sum = horz_scalar_product(src_x, x_filter) + rounding;
      dst[x] = (uint16_t)clamp(ROUND_POWER_OF_TWO(sum, round0_bits), 0,
                               WIENER_CLAMP_LIMIT(round0_bits, bd) - 1);
      x_q4 += x_step_q4;
    }
    src += src_stride;
    dst += dst_stride;
  }
}